

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

MacroActualArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroActualArgumentSyntax,slang::syntax::MacroActualArgumentSyntax_const&>
          (BumpAllocator *this,MacroActualArgumentSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  MacroActualArgumentSyntax *pMVar4;
  
  pMVar4 = (MacroActualArgumentSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MacroActualArgumentSyntax *)this->endPtr < pMVar4 + 1) {
    pMVar4 = (MacroActualArgumentSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pMVar4 + 1);
  }
  (pMVar4->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar3 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pMVar4->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pMVar4->super_SyntaxNode).field_0x4 = uVar3;
  (pMVar4->super_SyntaxNode).parent = pSVar1;
  uVar3 = *(undefined4 *)&(args->tokens).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->tokens).super_SyntaxListBase.super_SyntaxNode.parent;
  (pMVar4->tokens).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->tokens).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar4->tokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pMVar4->tokens).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pMVar4->tokens).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->tokens).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pMVar4->tokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e5cf8;
  (pMVar4->tokens).super_SyntaxListBase.childCount = (args->tokens).super_SyntaxListBase.childCount;
  sVar2 = (args->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pMVar4->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pMVar4->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pMVar4->tokens).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e6248;
  return pMVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }